

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O1

void InitZopfliCostModel(MemoryManager *m,ZopfliCostModel *self,BrotliDistanceParams *dist,
                        size_t num_bytes)

{
  uint uVar1;
  float *pfVar2;
  uint uVar3;
  
  uVar1 = dist->alphabet_size;
  self->num_bytes_ = num_bytes;
  if (num_bytes + 2 == 0) {
    pfVar2 = (float *)0x0;
  }
  else {
    pfVar2 = (float *)BrotliAllocate(m,(num_bytes + 2) * 4);
  }
  self->literal_costs_ = pfVar2;
  if ((ulong)dist->alphabet_size == 0) {
    pfVar2 = (float *)0x0;
  }
  else {
    pfVar2 = (float *)BrotliAllocate(m,(ulong)dist->alphabet_size << 2);
  }
  uVar3 = 0x220;
  if (uVar1 < 0x220) {
    uVar3 = uVar1;
  }
  self->cost_dist_ = pfVar2;
  self->distance_histogram_size = uVar3;
  return;
}

Assistant:

static void InitZopfliCostModel(
    MemoryManager* m, ZopfliCostModel* self, const BrotliDistanceParams* dist,
    size_t num_bytes) {
  uint32_t distance_histogram_size = dist->alphabet_size;
  if (distance_histogram_size > BROTLI_MAX_EFFECTIVE_DISTANCE_ALPHABET_SIZE) {
    distance_histogram_size = BROTLI_MAX_EFFECTIVE_DISTANCE_ALPHABET_SIZE;
  }
  self->num_bytes_ = num_bytes;
  self->literal_costs_ = BROTLI_ALLOC(m, float, num_bytes + 2);
  self->cost_dist_ = BROTLI_ALLOC(m, float, dist->alphabet_size);
  self->distance_histogram_size = distance_histogram_size;
  if (BROTLI_IS_OOM(m)) return;
}